

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int64_t skip_stream(archive_read *a,size_t skip_bytes)

{
  long lVar1;
  ssize_t sVar2;
  size_t local_40;
  size_t bytes;
  int64_t skipped_bytes;
  void *p;
  _7zip *zip;
  size_t skip_bytes_local;
  archive_read *a_local;
  
  p = a->format->data;
  local_40 = skip_bytes;
  zip = (_7zip *)skip_bytes;
  skip_bytes_local = (size_t)a;
  if (*(int *)((long)p + 0x100) == 0) {
    lVar1 = *(long *)((long)p + 0x38) + (ulong)*(uint *)(*(long *)((long)p + 0xa8) + 0x10) * 0x68;
    *(size_t *)(lVar1 + 0x60) = skip_bytes + *(long *)(lVar1 + 0x60);
    a_local = (archive_read *)skip_bytes;
  }
  else {
    while (local_40 != 0) {
      sVar2 = read_stream((archive_read *)skip_bytes_local,(void **)&skipped_bytes,local_40,0);
      if (sVar2 < 0) {
        return sVar2;
      }
      if (sVar2 == 0) {
        archive_set_error((archive *)skip_bytes_local,0x54,"Truncated 7-Zip file body");
        return -0x1e;
      }
      local_40 = local_40 - sVar2;
      if (*(long *)((long)p + 0x120) != 0) {
        read_consume((archive_read *)skip_bytes_local);
      }
    }
    a_local = (archive_read *)zip;
  }
  return (int64_t)a_local;
}

Assistant:

static int64_t
skip_stream(struct archive_read *a, size_t skip_bytes)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const void *p;
	int64_t skipped_bytes;
	size_t bytes = skip_bytes;

	if (zip->folder_index == 0) {
		/*
		 * Optimization for a list mode.
		 * Avoid unnecessary decoding operations.
		 */
		zip->si.ci.folders[zip->entry->folderIndex].skipped_bytes
		    += skip_bytes;
		return (skip_bytes);
	}

	while (bytes) {
		skipped_bytes = read_stream(a, &p, bytes, 0);
		if (skipped_bytes < 0)
			return (skipped_bytes);
		if (skipped_bytes == 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		bytes -= (size_t)skipped_bytes;
		if (zip->pack_stream_bytes_unconsumed)
			read_consume(a);
	}
	return (skip_bytes);
}